

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativePreciseTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::precise_as_function_name
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  NotSupportedError *this;
  bool local_92;
  bool local_79;
  int local_78;
  allocator<char> local_71;
  int ndx;
  deUint32 local_50;
  ContextType local_4c;
  byte local_45;
  byte local_32;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar3 = ::deGetFalse();
    pNVar1 = local_10;
    local_32 = 0;
    local_45 = 0;
    local_79 = false;
    if (dVar3 == 0) {
      std::allocator<char>::allocator();
      local_32 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"GL_EXT_gpu_shader5",&local_31);
      local_45 = 1;
      bVar2 = NegativeTestContext::isExtensionSupported(pNVar1,&local_30);
      local_92 = true;
      if (!bVar2) {
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_4c.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_50 = (deUint32)glu::ApiType::es(3,2);
        local_92 = glu::contextSupports(local_4c,(ApiType)local_50);
      }
      local_79 = local_92;
    }
    if ((local_45 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_30);
    }
    if ((local_32 & 1) != 0) {
      std::allocator<char>::~allocator(&local_31);
    }
    if (((local_79 ^ 0xffU) & 1) != 0) break;
    dVar3 = ::deGetFalse();
    pNVar1 = local_10;
    if (dVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ndx,"Test that precise cannot be used as a function name.",&local_71);
      NegativeTestContext::beginSection(pNVar1,(string *)&ndx);
      std::__cxx11::string::~string((string *)&ndx);
      std::allocator<char>::~allocator(&local_71);
      for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
        bVar2 = NegativeTestContext::isShaderSupported
                          (local_10,*(ShaderType *)
                                     ((anonymous_namespace)::s_shaderTypes + (long)local_78 * 4));
        if (bVar2) {
          generateAndVerifyShader
                    (local_10,*(ShaderType *)
                               ((anonymous_namespace)::s_shaderTypes + (long)local_78 * 4),
                     TEST_PRECISE_AS_FUNCTION_NAME);
        }
      }
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,
             "This test requires support for the extension GL_EXT_gpu_shader5 or context version 3.2 or higher."
             ,
             "ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativePreciseTests.cpp"
             ,0xb2);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void precise_as_function_name (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		ctx.isExtensionSupported("GL_EXT_gpu_shader5") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)),
		"This test requires support for the extension GL_EXT_gpu_shader5 or context version 3.2 or higher.");

	ctx.beginSection("Test that precise cannot be used as a function name.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaderTypes); ++ndx)
	{
		if (ctx.isShaderSupported(s_shaderTypes[ndx]))
			generateAndVerifyShader(ctx, s_shaderTypes[ndx], TEST_PRECISE_AS_FUNCTION_NAME);
	}
	ctx.endSection();
}